

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MFInterpolater.cpp
# Opt level: O0

void __thiscall
amrex::MFNodeBilinear::interp
          (MFNodeBilinear *this,MultiFab *crsemf,int ccomp,MultiFab *finemf,int fcomp,int nc,
          IntVect *ng,Geometry *param_8,Geometry *param_9,Box *dest_domain,IntVect *ratio,
          Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *param_12,int param_13)

{
  bool bVar1;
  undefined4 in_EDX;
  undefined4 in_R8D;
  undefined4 in_R9D;
  IntVect *in_stack_00000008;
  undefined8 *in_stack_00000028;
  Box result;
  Box *fbox;
  Array4<const_double> *crse;
  Array4<double> *fine;
  MFIter mfi;
  Box *in_stack_fffffffffffffdc8;
  MFIter *in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffddc;
  MFIter *in_stack_fffffffffffffde0;
  uchar in_stack_fffffffffffffdf7;
  FabArrayBase *in_stack_fffffffffffffdf8;
  MFIter *in_stack_fffffffffffffe00;
  anon_class_152_5_1bf069c6 *in_stack_fffffffffffffe10;
  int in_stack_fffffffffffffe1c;
  undefined4 uVar2;
  undefined4 in_stack_fffffffffffffe24;
  undefined1 auStack_1d8 [64];
  undefined4 local_198;
  undefined8 local_194;
  undefined4 local_18c;
  undefined1 local_184 [28];
  Box local_168;
  undefined1 local_14c [36];
  undefined1 local_128 [64];
  undefined1 *local_e8;
  undefined1 local_e0 [64];
  undefined1 *local_a0;
  MFIter local_98;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_24;
  undefined1 *local_8;
  
  local_38 = in_R9D;
  local_34 = in_R8D;
  local_24 = in_EDX;
  MFIter::MFIter(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf7);
  while( true ) {
    bVar1 = MFIter::isValid(&local_98);
    if (!bVar1) break;
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
               in_stack_fffffffffffffdd0);
    local_a0 = local_e0;
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
               in_stack_fffffffffffffdd0);
    local_e8 = local_128;
    MFIter::validbox(in_stack_fffffffffffffde0);
    local_8 = local_184;
    Box::grow(&local_168,in_stack_00000008);
    Box::operator&((Box *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    in_stack_fffffffffffffdd0 = (MFIter *)local_14c;
    in_stack_fffffffffffffddc = local_38;
    local_14c._28_8_ = in_stack_fffffffffffffdd0;
    memcpy(&stack0xfffffffffffffde0,local_a0,0x3c);
    uVar2 = local_34;
    memcpy(auStack_1d8,local_e8,0x3c);
    local_198 = local_24;
    local_194 = *in_stack_00000028;
    local_18c = *(undefined4 *)(in_stack_00000028 + 1);
    LoopConcurrentOnCpu<amrex::MFNodeBilinear::interp(amrex::MultiFab_const&,int,amrex::MultiFab&,int,int,amrex::IntVect_const&,amrex::Geometry_const&,amrex::Geometry_const&,amrex::Box_const&,amrex::IntVect_const&,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int)::__0>
              ((Box *)CONCAT44(in_stack_fffffffffffffe24,uVar2),in_stack_fffffffffffffe1c,
               in_stack_fffffffffffffe10);
    MFIter::operator++(&local_98);
  }
  MFIter::~MFIter(in_stack_fffffffffffffdd0);
  return;
}

Assistant:

void
MFNodeBilinear::interp (MultiFab const& crsemf, int ccomp, MultiFab& finemf, int fcomp, int nc,
                        IntVect const& ng, Geometry const&, Geometry const&,
                        Box const& dest_domain, IntVect const& ratio,
                        Vector<BCRec> const&, int)
{
#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion()) {
        auto const& crse = crsemf.const_arrays();
        auto const& fine = finemf.arrays();
        ParallelFor(finemf, ng, nc,
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
        {
            if (dest_domain.contains(i,j,k)) {
                mf_nodebilin_interp(i,j,k,n, fine[box_no], fcomp, crse[box_no], ccomp, ratio);
            }
        });
        Gpu::streamSynchronize();
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
        for (MFIter mfi(finemf); mfi.isValid(); ++mfi) {
            auto const& fine = finemf.array(mfi);
            auto const& crse = crsemf.const_array(mfi);
            Box const& fbox = amrex::grow(mfi.validbox(), ng) & dest_domain;
            amrex::LoopConcurrentOnCpu(fbox, nc,
            [=] (int i, int j, int k, int n) noexcept
            {
                mf_nodebilin_interp(i,j,k,n, fine, fcomp, crse, ccomp, ratio);
            });
        }
    }
}